

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCDecoder.cpp
# Opt level: O3

bool __thiscall gnilk::IPCBinaryDecoder::Process(IPCBinaryDecoder *this)

{
  undefined1 uVar1;
  int iVar2;
  long *plVar3;
  IPCMsgHeader header;
  ulong local_10;
  undefined4 extraout_var;
  
  local_10 = 1;
  iVar2 = (**(this->super_IPCDecoderBase).super_IPCReader._vptr_IPCReader)(this,&local_10,8);
  if (-1 < iVar2) {
    iVar2 = (*(this->deserializer->super_IPCObject)._vptr_IPCObject[2])
                      (this->deserializer,local_10 >> 8 & 0xff);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar3 != (long *)0x0) {
      uVar1 = (**(code **)(*plVar3 + 0x18))(plVar3,this);
      return (bool)uVar1;
    }
  }
  return false;
}

Assistant:

bool IPCBinaryDecoder::Process() {
    IPCMsgHeader header;
    if (Read(&header, sizeof(header)) < 0) {
        return false;
    }
    auto handler = deserializer.GetDeserializerForObject(header.msgId);
    if (handler == nullptr) {
        return false;
    }
    return handler->Unmarshal(*this);
}